

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTADSBHub.cpp
# Opt level: O1

bool __thiscall ADSBHubConnection::StreamProcessDataVRSLine(ADSBHubConnection *this,uint8_t *pStart)

{
  byte *pbVar1;
  float fVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  short sVar6;
  ushort uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  bool bVar11;
  int ln;
  char *szMsg;
  float *pfVar12;
  float *pfVar13;
  FDKeyTy key;
  FDKeyTy local_80;
  long *local_50 [2];
  long local_40 [2];
  
  bVar3 = *pStart;
  if (bVar3 < 10) {
    if (0 < (int)dataRefs.iLogLevel) {
      return false;
    }
    LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBHub.cpp"
           ,0x207,"StreamProcessDataVRSLine",logDEBUG,"Ignoring too short a message of length %d",
           (ulong)bVar3);
    return false;
  }
  LTFlightData::FDKeyTy::FDKeyTy
            (&local_80,KEY_ICAO,
             (ulong)pStart[6] | (ulong)((uint)pStart[5] << 8 | (uint)pStart[4] << 0x10));
  if (((this->fdKey).eKeyType != local_80.eKeyType) || ((this->fdKey).num != local_80.num)) {
    ProcessPlaneData(this);
    (this->fdKey).eKeyType = local_80.eKeyType;
    std::__cxx11::string::_M_assign((string *)&(this->fdKey).key);
    (this->fdKey).num = local_80.num;
  }
  pfVar12 = (float *)(pStart + (uint)bVar3);
  bVar3 = pStart[7];
  bVar4 = pStart[8];
  pfVar13 = (float *)(pStart + 9);
  if ((bVar3 & 1) == 0) {
LAB_0014d4f3:
    if ((bVar3 & 2) != 0) {
      if (pfVar12 < (float *)((long)pfVar13 + 2U)) {
        if (3 < (int)dataRefs.iLogLevel) goto LAB_0014d768;
        szMsg = "Line too short for next value Altitude";
        ln = 0x22d;
        goto LAB_0014d74a;
      }
      bVar5 = *(byte *)pfVar13;
      uVar8 = (uint)bVar5 << 0x10;
      uVar10 = (uint)*(byte *)((long)pfVar13 + 1) << 8;
      pbVar1 = (byte *)((long)pfVar13 + 2);
      pfVar13 = (float *)((long)pfVar13 + 3);
      uVar9 = -((uint)*pbVar1 | uVar8 & 0x7fffff | uVar10);
      if (-1 < (char)bVar5) {
        uVar9 = *pbVar1 | uVar8 | uVar10;
      }
      (this->pos)._alt = (double)(int)uVar9 * 0.3048;
    }
    if ((bVar3 & 4) != 0) {
      if (pfVar12 < (float *)((long)pfVar13 + 1U)) {
        if (3 < (int)dataRefs.iLogLevel) goto LAB_0014d768;
        szMsg = "Line too short for next value Ground Speed";
        ln = 0x233;
        goto LAB_0014d74a;
      }
      sVar6 = *(short *)pfVar13;
      pfVar13 = (float *)((long)pfVar13 + 2);
      (this->dyn).spd = (double)(int)sVar6;
    }
    if ((bVar3 & 8) != 0) {
      if (pfVar12 < (float *)((long)pfVar13 + 1U)) {
        if (3 < (int)dataRefs.iLogLevel) goto LAB_0014d768;
        szMsg = "Line too short for next value Track";
        ln = 0x239;
        goto LAB_0014d74a;
      }
      sVar6 = *(short *)pfVar13;
      pfVar13 = (float *)((long)pfVar13 + 2);
      (this->dyn).heading = (double)(int)sVar6 / 10.0;
      (this->pos)._head = (double)(int)sVar6 / 10.0;
    }
    if ((bVar3 & 0x10) != 0) {
      if (pfVar12 < (float *)((long)pfVar13 + 3U)) {
        if (3 < (int)dataRefs.iLogLevel) goto LAB_0014d768;
        szMsg = "Line too short for next value Latitude";
        ln = 0x23f;
        goto LAB_0014d74a;
      }
      fVar2 = *pfVar13;
      pfVar13 = pfVar13 + 1;
      (this->pos)._lat = (double)fVar2;
    }
    if ((bVar3 & 0x20) != 0) {
      if (pfVar12 < (float *)((long)pfVar13 + 3U)) {
        if (3 < (int)dataRefs.iLogLevel) goto LAB_0014d768;
        szMsg = "Line too short for next value Longitude";
        ln = 0x245;
        goto LAB_0014d74a;
      }
      fVar2 = *pfVar13;
      pfVar13 = pfVar13 + 1;
      (this->pos)._lon = (double)fVar2;
    }
    if ((bVar3 & 0x40) != 0) {
      if (pfVar12 < (float *)((long)pfVar13 + 1U)) {
        if (3 < (int)dataRefs.iLogLevel) goto LAB_0014d768;
        szMsg = "Line too short for next value VSI";
        ln = 0x24b;
        goto LAB_0014d74a;
      }
      sVar6 = *(short *)pfVar13;
      pfVar13 = (float *)((long)pfVar13 + 2);
      (this->dyn).vsi = (double)(int)sVar6;
    }
    if ((char)bVar3 < '\0') {
      if (pfVar12 < (float *)((long)pfVar13 + 1U)) {
        if (3 < (int)dataRefs.iLogLevel) goto LAB_0014d768;
        szMsg = "Line too short for next value Squawk";
        ln = 0x251;
        goto LAB_0014d74a;
      }
      uVar7 = *(ushort *)pfVar13;
      pfVar13 = (float *)((long)pfVar13 + 2);
      (this->dyn).radar.code = (ulong)uVar7;
    }
    bVar11 = true;
    if (bVar4 == 0) goto LAB_0014d76a;
    if (pfVar13 <= pfVar12) {
      if ((bVar4 & 8) != 0) {
        (this->pos).f =
             (posFlagsTy)
             (((ushort)*(undefined4 *)&(this->pos).f & 0xfcff |
              (ushort)((*(byte *)pfVar13 & 8) >> 3) << 8) + 0x100);
      }
      goto LAB_0014d76a;
    }
    if (3 < (int)dataRefs.iLogLevel) goto LAB_0014d768;
    szMsg = "Line too short for next value Flags";
    ln = 599;
  }
  else {
    if ((float *)((long)pfVar13 + ((ulong)*(byte *)pfVar13 - 1)) <= pfVar12) {
      pfVar13 = (float *)(pStart + (ulong)*(byte *)pfVar13 + 10);
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,pStart + 10,pfVar13);
      std::__cxx11::string::operator=((string *)&(this->stat).call,(string *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      goto LAB_0014d4f3;
    }
    if (3 < (int)dataRefs.iLogLevel) {
LAB_0014d768:
      bVar11 = false;
      goto LAB_0014d76a;
    }
    szMsg = "Line too short for next value Call Sign";
    ln = 0x227;
  }
LAB_0014d74a:
  bVar11 = false;
  LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBHub.cpp"
         ,ln,"StreamProcessDataVRSLine",logERR,szMsg);
LAB_0014d76a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.key._M_dataplus._M_p != &local_80.key.field_2) {
    operator_delete(local_80.key._M_dataplus._M_p,local_80.key.field_2._M_allocated_capacity + 1);
  }
  return bVar11;
}

Assistant:

bool ADSBHubConnection::StreamProcessDataVRSLine (const uint8_t* pStart)
{
    // end of line, based on fact that line length is stored in first byte
    const size_t len = size_t(pStart[0]);
    if (len < 10) {
        LOG_MSG(logDEBUG, "Ignoring too short a message of length %d", int(len));
        return false;
    }
    const uint8_t* const pEnd = pStart + len;
    
    // Skip over length, checksum, transmission type:
    pStart += 4;
    
    // next 3 bytes is the ADS-B hex id
    LTFlightData::FDKeyTy key (LTFlightData::KEY_ICAO,
                               (unsigned long)(pStart[0]) << 16 |
                               (unsigned long)(pStart[1]) <<  8 |
                               (unsigned long)(pStart[2]));
    pStart += 3;

    // Change of plane? Then process previous data first before continuing
    if (fdKey != key) {
        ProcessPlaneData();
        // New plane
        fdKey = key;
    }
    
    // remember list of fields and list of flags
    uint8_t fields = pStart[0];
    uint8_t flags  = pStart[1];
    pStart += 2;
    
    // --- process fields ---
    TEST_END("no fields processed")
    
    // Callsign
    if (fields & 0x01) {
        TEST_LEN(size_t(pStart[0]), "Call Sign");
        stat.call = VRSString(pStart);
    }

    // Altitude
    if (fields & 0x02) {
        TEST_LEN(3, "Altitude");
        pos.SetAltFt((double)VRSFloatInt(pStart));
    }
    
    // Ground Speed
    if (fields & 0x04) {
        TEST_LEN(2, "Ground Speed");
        dyn.spd = (double)VRSFloatShort(pStart);
    }
    
    // Track * 10.0
    if (fields & 0x08) {
        TEST_LEN(2, "Track");
        pos.heading() = dyn.heading = (double)VRSFloatShort(pStart) / 10.0;
    }
    
    // Latitude
    if (fields & 0x10) {
        TEST_LEN(4, "Latitude");
        pos.lat() = (double)VRSFloat(pStart);
    }
    
    // Longitude
    if (fields & 0x20) {
        TEST_LEN(4, "Longitude");
        pos.lon() = (double)VRSFloat(pStart);
    }
    
    // Vertical Speed
    if (fields & 0x40) {
        TEST_LEN(2, "VSI");
        dyn.vsi = (double)VRSFloatShort(pStart);
    }
    
    // Squawk
    if (fields & 0x80) {
        TEST_LEN(2, "Squawk");
        dyn.radar.code = (long)VRSShort(pStart);
    }

    // --- Flags ---
    if (flags) {
        TEST_LEN(1, "Flags");
        // Only one we are interested in is 'On ground'
        if (flags & 0x08) {
            pos.f.onGrnd =
                (pStart[0] & 0x08) ? GND_ON : GND_OFF;
        }
        ++pStart;
    }
    
    return true;
}